

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_trainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t parameters)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZDICT_cover_params_t parameters_00;
  undefined1 auVar3 [16];
  ZDICT_cover_params_t ZVar4;
  int iVar5;
  size_t sVar6;
  char *__ptr;
  size_t sStackY_e0;
  COVER_map_t local_a0;
  COVER_ctx_t ctx;
  
  ZVar4 = parameters;
  g_displayLevel = parameters.zParams.notificationLevel;
  if (parameters.d == 0) {
LAB_0017724c:
    sVar6 = 0xffffffffffffffd6;
    if ((int)parameters.zParams.notificationLevel < 1) {
      return 0xffffffffffffffd6;
    }
    __ptr = "Cover parameters incorrect\n";
    sStackY_e0 = 0x1b;
  }
  else {
    if (((parameters.k < parameters.d) || (parameters.k == 0)) ||
       (dictBufferCapacity < parameters.k)) goto LAB_0017724c;
    if (nbSamples != 0) {
      if (0xff < dictBufferCapacity) {
        sVar6 = COVER_ctx_init(&ctx,samplesBuffer,samplesSizes,nbSamples,parameters.d,1.0);
        if (0xffffffffffffff88 < sVar6) {
          return sVar6;
        }
        COVER_warnOnSmallCorpus(dictBufferCapacity,ctx.suffixSize,g_displayLevel);
        iVar5 = COVER_map_init(&local_a0,(parameters.k - parameters.d) + 1);
        if (iVar5 != 0) {
          if (1 < g_displayLevel) {
            fwrite("Building dictionary\n",0x14,1,_stderr);
            fflush(_stderr);
          }
          uVar1 = parameters.zParams._0_8_;
          uVar2 = parameters._40_8_;
          auVar3 = parameters._0_16_;
          parameters_00.splitPoint._0_4_ = 0;
          parameters_00.k = auVar3._0_4_;
          parameters_00.d = auVar3._4_4_;
          parameters_00.steps = auVar3._8_4_;
          parameters_00.nbThreads = auVar3._12_4_;
          parameters_00.splitPoint._4_4_ = 0x3ff00000;
          parameters_00.shrinkDict = parameters.shrinkDict;
          parameters_00.shrinkDictMaxRegression = parameters.shrinkDictMaxRegression;
          parameters_00.zParams.compressionLevel = (int)uVar1;
          parameters_00.zParams.notificationLevel = (int)((ulong)uVar1 >> 0x20);
          parameters_00._40_8_ = uVar2;
          sVar6 = COVER_buildDictionary
                            (&ctx,ctx.freqs,&local_a0,dictBuffer,dictBufferCapacity,parameters_00);
          sVar6 = ZDICT_finalizeDictionary
                            (dictBuffer,dictBufferCapacity,(void *)(sVar6 + (long)dictBuffer),
                             dictBufferCapacity - sVar6,samplesBuffer,samplesSizes,nbSamples,
                             ZVar4.zParams);
          if ((sVar6 < 0xffffffffffffff89) && (1 < g_displayLevel)) {
            fprintf(_stderr,"Constructed dictionary of size %u\n",sVar6 & 0xffffffff);
            fflush(_stderr);
          }
          COVER_ctx_destroy(&ctx);
          free(local_a0.data);
          return sVar6;
        }
        if (0 < g_displayLevel) {
          fwrite("Failed to allocate dmer map: out of memory\n",0x2b,1,_stderr);
          fflush(_stderr);
        }
        COVER_ctx_destroy(&ctx);
        return 0xffffffffffffffc0;
      }
      sVar6 = 0xffffffffffffffba;
      if ((int)parameters.zParams.notificationLevel < 1) {
        return 0xffffffffffffffba;
      }
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      goto LAB_00177295;
    }
    sVar6 = 0xffffffffffffffb8;
    if ((int)parameters.zParams.notificationLevel < 1) {
      return 0xffffffffffffffb8;
    }
    __ptr = "Cover must have at least one input file\n";
    sStackY_e0 = 0x28;
  }
  fwrite(__ptr,sStackY_e0,1,_stderr);
LAB_00177295:
  fflush(_stderr);
  return sVar6;
}

Assistant:

ZDICTLIB_API size_t ZDICT_trainFromBuffer_cover(
    void *dictBuffer, size_t dictBufferCapacity,
    const void *samplesBuffer, const size_t *samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t parameters)
{
  BYTE* const dict = (BYTE*)dictBuffer;
  COVER_ctx_t ctx;
  COVER_map_t activeDmers;
  parameters.splitPoint = 1.0;
  /* Initialize global data */
  g_displayLevel = (int)parameters.zParams.notificationLevel;
  /* Checks */
  if (!COVER_checkParameters(parameters, dictBufferCapacity)) {
    DISPLAYLEVEL(1, "Cover parameters incorrect\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  /* Initialize context and activeDmers */
  {
    size_t const initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                      parameters.d, parameters.splitPoint);
    if (ZSTD_isError(initVal)) {
      return initVal;
    }
  }
  COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, g_displayLevel);
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    COVER_ctx_destroy(&ctx);
    return ERROR(memory_allocation);
  }

  DISPLAYLEVEL(2, "Building dictionary\n");
  {
    const size_t tail =
        COVER_buildDictionary(&ctx, ctx.freqs, &activeDmers, dictBuffer,
                              dictBufferCapacity, parameters);
    const size_t dictionarySize = ZDICT_finalizeDictionary(
        dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
        samplesBuffer, samplesSizes, nbSamples, parameters.zParams);
    if (!ZSTD_isError(dictionarySize)) {
      DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                   (unsigned)dictionarySize);
    }
    COVER_ctx_destroy(&ctx);
    COVER_map_destroy(&activeDmers);
    return dictionarySize;
  }
}